

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O3

void __thiscall xmrig::CpuBackend::setJob(CpuBackend *this,Job *job)

{
  bool bVar1;
  int iVar2;
  Config *this_00;
  CpuConfig *this_01;
  Miner *miner;
  pointer pCVar3;
  long lVar4;
  pointer pCVar5;
  ulong uVar6;
  char *pcVar7;
  CpuBackendPrivate *pCVar8;
  pointer pCVar9;
  vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> threads;
  vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> local_48;
  
  iVar2 = (*(this->super_IBackend)._vptr_IBackend[2])();
  if ((char)iVar2 == '\0') {
    (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
    return;
  }
  this_00 = Base::config(&this->d_ptr->controller->super_Base);
  this_01 = Config::cpu(this_00);
  miner = Controller::miner(this->d_ptr->controller);
  CpuConfig::get(&local_48,this_01,miner);
  pCVar9 = (this->d_ptr->threads).
           super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar3 = (this->d_ptr->threads).
           super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pCVar9 == pCVar3) ||
     (pCVar5 = local_48.
               super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
               _M_impl.super__Vector_impl_data._M_start,
     (long)pCVar3 - (long)pCVar9 !=
     (long)local_48.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
           _M_impl.super__Vector_impl_data._M_finish -
     (long)local_48.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
           _M_impl.super__Vector_impl_data._M_start)) {
LAB_0015a8f9:
    if (local_48.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_48.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      Log::print(WARNING,
                 "%s \x1b[1;31mdisabled\x1b[0m\x1b[0;33m (no suitable configuration found)\x1b[0m",
                 "\x1b[46;1m\x1b[1;37m cpu \x1b[0m");
      (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
    }
    else {
      (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
      pCVar5 = local_48.
               super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pCVar3 = local_48.
               super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pCVar8 = this->d_ptr;
      pCVar9 = (pCVar8->threads).
               super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (pCVar8->threads).
      super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_48.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (pCVar8->threads).
      super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_48.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (pCVar8->threads).
      super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_48.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_48.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pCVar9 != (pointer)0x0) {
        operator_delete(pCVar9);
        pCVar8 = this->d_ptr;
        pCVar3 = (pCVar8->threads).
                 super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pCVar5 = (pCVar8->threads).
                 super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar6 = ((long)pCVar5 - (long)pCVar3 >> 3) * -0x3333333333333333;
      pcVar7 = "";
      if (1 < uVar6) {
        pcVar7 = "s";
      }
      Log::print(INFO,
                 "%s use profile \x1b[44m\x1b[1;37m cn/blur \x1b[0m\x1b[1;37m (\x1b[1;36m%zu\x1b[0m\x1b[1;37m thread%s)\x1b[0m scratchpad \x1b[1;36m%zu KB\x1b[0m"
                 ,"\x1b[46;1m\x1b[1;37m cpu \x1b[0m",uVar6,pcVar7,0x400);
      (pCVar8->status).m_memory = 0x100000;
      (pCVar8->status).m_errors = 0;
      (pCVar8->status).m_hugePages = 0;
      (pCVar8->status).m_pages = 0;
      (pCVar8->status).m_started = 0;
      (pCVar8->status).m_threads =
           ((long)(pCVar8->threads).
                  super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pCVar8->threads).
                  super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      (pCVar8->status).m_ways = 0;
      lVar4 = std::chrono::_V2::steady_clock::now();
      (pCVar8->status).m_ts = lVar4 / 1000000;
      Workers<xmrig::CpuLaunchData>::start(&pCVar8->workers,&pCVar8->threads);
    }
  }
  else {
    do {
      bVar1 = CpuLaunchData::isEqual(pCVar9,pCVar5);
      if (!bVar1) goto LAB_0015a8f9;
      pCVar9 = pCVar9 + 1;
      pCVar5 = pCVar5 + 1;
    } while (pCVar9 != pCVar3);
  }
  if (local_48.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void xmrig::CpuBackend::setJob(const Job &job)
{
    if (!isEnabled()) {
        return stop();
    }

    const CpuConfig &cpu = d_ptr->controller->config()->cpu();

    std::vector<CpuLaunchData> threads = cpu.get(d_ptr->controller->miner());
    if (!d_ptr->threads.empty() && d_ptr->threads.size() == threads.size() && std::equal(d_ptr->threads.begin(), d_ptr->threads.end(), threads.begin())) {
        return;
    }

    if (threads.empty()) {
        LOG_WARN("%s " RED_BOLD("disabled") YELLOW(" (no suitable configuration found)"), tag);

        return stop();
    }

    stop();

    d_ptr->threads = std::move(threads);
    d_ptr->start();
}